

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::Factor> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Factor>(RecursiveDescentParser *this)

{
  istream *piVar1;
  long lVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Factor> sVar5;
  allocator local_39;
  string local_38;
  
  std::make_shared<MyCompiler::Factor>();
  if (in_RSI->sym == NUMBER) {
    *(undefined4 *)(this->stream + 4) = 1;
    parse<MyCompiler::Number>((RecursiveDescentParser *)&local_38);
    std::__shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2> *)(this->stream + 0x58)
               ,(__shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
  }
  else if (in_RSI->sym == IDENT) {
    *(undefined4 *)(this->stream + 4) = 0;
    parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_38);
    std::__shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2> *)(this->stream + 0x48),
               (__shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,"expression expected",&local_39);
    except(in_RSI,LPAREN,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    *(undefined4 *)(this->stream + 4) = 2;
    parse<MyCompiler::Expression>((RecursiveDescentParser *)&local_38);
    std::__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *)
               (this->stream + 0x68),
               (__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
    std::__cxx11::string::string((string *)&local_38,"right parenthesis expected",&local_39);
    except(in_RSI,RPAREN,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    piVar1 = this->stream;
    lVar2 = *(long *)(piVar1 + 0x68);
    _Var4._M_pi = extraout_RDX_00;
    if ((*(long *)(lVar2 + 0x48) != 0) || (*(long *)(lVar2 + 0x68) != *(long *)(lVar2 + 0x70)))
    goto LAB_00104e42;
    lVar2 = *(long *)(lVar2 + 0x58);
    lVar3 = *(long *)(lVar2 + 0x48);
    if ((*(int *)(lVar3 + 4) != 1) || (*(long *)(lVar2 + 0x58) != *(long *)(lVar2 + 0x60)))
    goto LAB_00104e42;
    *(undefined4 *)(piVar1 + 4) = 1;
    std::__shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2> *)(piVar1 + 0x58),
               (__shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x58));
    local_38._M_dataplus._M_p = (pointer)0x0;
    local_38._M_string_length = 0;
    std::__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *)
               (this->stream + 0x68),
               (__shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
  _Var4._M_pi = extraout_RDX;
LAB_00104e42:
  sVar5.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Factor>)
         sVar5.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Factor> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Factor>();

    if (sym == SymbolType::IDENT)
    {
        pResult->caseNum = 0;
        pResult->pIdent = parse<Ident>();
    }
    else if (sym == SymbolType::NUMBER)
    {
        pResult->caseNum = 1;
        pResult->pNumber = parse<Number>();
    }
    else
    {
        except(SymbolType::LPAREN, "expression expected");
        pResult->caseNum = 2;
        pResult->pExpression = parse<Expression>();
        except(SymbolType::RPAREN, "right parenthesis expected");
        if (pResult->pExpression->pAddSubOp == nullptr && pResult->pExpression->vAddSubOpExpression.empty() &&
            pResult->pExpression->pTerm->pFactor->caseNum == 1 && pResult->pExpression->pTerm->vMulDivOpFactor.empty())
        {
            pResult->caseNum = 1;
            pResult->pNumber = pResult->pExpression->pTerm->pFactor->pNumber;
            pResult->pExpression = nullptr;
        }
    }

    return pResult;
}